

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O2

void ssdp_read(SOCKET *rsock,fd_set *set)

{
  int iVar1;
  
  iVar1 = *rsock;
  if ((iVar1 != -1) &&
     (((ulong)set->__fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) != 0)) {
    iVar1 = readFromSSDPSocket(iVar1);
    if (iVar1 != 0) {
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x224,
                 "miniserver: Error in readFromSSDPSocket(%d): closing socket\n",(ulong)(uint)*rsock
                );
      sock_close(*rsock);
      *rsock = -1;
    }
  }
  return;
}

Assistant:

static void ssdp_read(SOCKET *rsock, fd_set *set)
{
	if (*rsock != INVALID_SOCKET && FD_ISSET(*rsock, set)) {
		int ret = readFromSSDPSocket(*rsock);
		if (ret != 0) {
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"miniserver: Error in readFromSSDPSocket(%d): "
				"closing socket\n",
				*rsock);
			sock_close(*rsock);
			*rsock = INVALID_SOCKET;
		}
	}
}